

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::generateQuads
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 InputType type,GLValue min,GLValue max,float gridSize)

{
  char *pcVar1;
  Half min_00;
  Half max_00;
  
  min_00.m_value = min.field_1._0_2_;
  max_00.m_value = max.field_1._0_2_;
  switch(type) {
  case INPUTTYPE_FLOAT:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                       (seed,count,componentCount,offset,stride,primitive,min.field_1.fl.m_value,
                        max.field_1.fl.m_value,gridSize);
    return pcVar1;
  case INPUTTYPE_FIXED:
    pcVar1 = createQuads<deqp::gls::GLValue::Fixed>
                       (seed,count,componentCount,offset,stride,primitive,min.field_1.fi.m_value,
                        max.field_1.fi.m_value,gridSize);
    break;
  case INPUTTYPE_DOUBLE:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                       (seed,count,componentCount,offset,stride,primitive,min.field_1.d,
                        max.field_1.d,gridSize);
    return pcVar1;
  case INPUTTYPE_BYTE:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                       (seed,count,componentCount,offset,stride,primitive,
                        (WrappedType<signed_char>)min.field_1._0_1_,
                        (WrappedType<signed_char>)max.field_1._0_1_,gridSize);
    break;
  case INPUTTYPE_SHORT:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedType<short>>
                       (seed,count,componentCount,offset,stride,primitive,
                        (WrappedType<short>)min_00.m_value,(WrappedType<short>)max_00.m_value,
                        gridSize);
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                       (seed,count,componentCount,offset,stride,primitive,
                        (WrappedType<unsigned_char>)min.field_1._0_1_,
                        (WrappedType<unsigned_char>)max.field_1._0_1_,gridSize);
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                       (seed,count,componentCount,offset,stride,primitive,
                        (WrappedType<unsigned_short>)min_00.m_value,
                        (WrappedType<unsigned_short>)max_00.m_value,gridSize);
    break;
  case INPUTTYPE_INT:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedType<int>>
                       (seed,count,componentCount,offset,stride,primitive,
                        (WrappedType<int>)min.field_1.fl.m_value,
                        (WrappedType<int>)max.field_1.fl.m_value,gridSize);
    break;
  case INPUTTYPE_UNSIGNED_INT:
    pcVar1 = createQuads<deqp::gls::GLValue::WrappedType<unsigned_int>>
                       (seed,count,componentCount,offset,stride,primitive,
                        (WrappedType<unsigned_int>)min.field_1.fl.m_value,
                        (WrappedType<unsigned_int>)max.field_1.fl.m_value,gridSize);
    break;
  case INPUTTYPE_HALF:
    pcVar1 = createQuads<deqp::gls::GLValue::Half>
                       (seed,count,componentCount,offset,stride,primitive,min_00,max_00,gridSize);
    break;
  case INPUTTYPE_UNSIGNED_INT_2_10_10_10:
  case INPUTTYPE_INT_2_10_10_10:
    pcVar1 = createQuadsPacked(seed,count,componentCount,offset,stride,primitive);
    return pcVar1;
  default:
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

char* RandomArrayGenerator::generateQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, Array::InputType type, GLValue min, GLValue max, float gridSize)
{
	char* data = DE_NULL;

	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
			data = createQuads<GLValue::Float>(seed, count, componentCount, offset, stride, primitive, min.fl, max.fl, gridSize);
			break;

		case Array::INPUTTYPE_FIXED:
			data = createQuads<GLValue::Fixed>(seed, count, componentCount, offset, stride, primitive, min.fi, max.fi, gridSize);
			break;

		case Array::INPUTTYPE_DOUBLE:
			data = createQuads<GLValue::Double>(seed, count, componentCount, offset, stride, primitive, min.d, max.d, gridSize);
			break;

		case Array::INPUTTYPE_BYTE:
			data = createQuads<GLValue::Byte>(seed, count, componentCount, offset, stride, primitive, min.b, max.b, gridSize);
			break;

		case Array::INPUTTYPE_SHORT:
			data = createQuads<GLValue::Short>(seed, count, componentCount, offset, stride, primitive, min.s, max.s, gridSize);
			break;

		case Array::INPUTTYPE_UNSIGNED_BYTE:
			data = createQuads<GLValue::Ubyte>(seed, count, componentCount, offset, stride, primitive, min.ub, max.ub, gridSize);
			break;

		case Array::INPUTTYPE_UNSIGNED_SHORT:
			data = createQuads<GLValue::Ushort>(seed, count, componentCount, offset, stride, primitive, min.us, max.us, gridSize);
			break;

		case Array::INPUTTYPE_UNSIGNED_INT:
			data = createQuads<GLValue::Uint>(seed, count, componentCount, offset, stride, primitive, min.ui, max.ui, gridSize);
			break;

		case Array::INPUTTYPE_INT:
			data = createQuads<GLValue::Int>(seed, count, componentCount, offset, stride, primitive, min.i, max.i, gridSize);
			break;

		case Array::INPUTTYPE_HALF:
			data = createQuads<GLValue::Half>(seed, count, componentCount, offset, stride, primitive, min.h, max.h, gridSize);
			break;

		case Array::INPUTTYPE_INT_2_10_10_10:
		case Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10:
			data = createQuadsPacked(seed, count, componentCount, offset, stride, primitive);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return data;
}